

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.cpp
# Opt level: O1

string * __thiscall
banksia::formatPeriod_abi_cxx11_(string *__return_storage_ptr__,banksia *this,int seconds)

{
  ostream oVar1;
  undefined1 uVar2;
  ostream *poVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  long lVar8;
  ostringstream stringStream;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  iVar5 = (int)this;
  if (0x1517f < iVar5) {
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (local_1a0,(uint)(ushort)(((ulong)this & 0xffffffff) / 0x15180));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"d ",2);
  }
  iVar6 = iVar5 / 0xe10;
  iVar6 = iVar6 + (((uint)(iVar6 / 6 + (iVar6 >> 0x1f)) >> 2) - (iVar6 >> 0x1f)) * -0x18;
  if (0 < iVar6) {
    poVar3 = (ostream *)std::ostream::operator<<(local_1a0,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    poVar7 = poVar3 + *(long *)(*(long *)poVar3 + -0x18);
    if (poVar3[*(long *)(*(long *)poVar3 + -0x18) + 0xe1] == (ostream)0x0) {
      oVar1 = (ostream)std::ios::widen((char)poVar7);
      poVar7[0xe0] = oVar1;
      poVar7[0xe1] = (ostream)0x1;
    }
    poVar7[0xe0] = (ostream)0x30;
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  }
  poVar3 = (ostream *)std::ostream::operator<<(local_1a0,(iVar5 / 0x3c) % 0x3c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  poVar7 = poVar3 + *(long *)(*(long *)poVar3 + -0x18);
  if (poVar3[*(long *)(*(long *)poVar3 + -0x18) + 0xe1] == (ostream)0x0) {
    oVar1 = (ostream)std::ios::widen((char)poVar7);
    poVar7[0xe0] = oVar1;
    poVar7[0xe1] = (ostream)0x1;
  }
  poVar7[0xe0] = (ostream)0x30;
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  plVar4 = (long *)std::ostream::operator<<(poVar3,iVar5 % 0x3c);
  lVar8 = (long)plVar4 + *(long *)(*plVar4 + -0x18);
  if (*(char *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0xe1) == '\0') {
    uVar2 = std::ios::widen((char)lVar8);
    *(undefined1 *)(lVar8 + 0xe0) = uVar2;
    *(undefined1 *)(lVar8 + 0xe1) = 1;
  }
  *(undefined1 *)(lVar8 + 0xe0) = 0x20;
  *(undefined8 *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x10) = 0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string formatPeriod(int seconds)
    {
        int s = seconds % 60, minutes = seconds / 60, m = minutes % 60, hours = minutes / 60, h = hours % 24, d = hours / 24;
        
        std::ostringstream stringStream;
        if (d > 0) {
            stringStream << d << "d ";
        }
        if (h > 0) {
            stringStream << h << ":"
            << std::setfill('0') << std::setw(2);
        }
        
        stringStream
        << m << ":"
        << std::setfill('0') << std::setw(2)
        << s
        << std::setfill(' ') << std::setw(0);
        return stringStream.str();
    }